

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O3

entry_iterator * __thiscall Pathie::entry_iterator::operator++(entry_iterator *this,int param_1)

{
  dirent *pdVar1;
  size_t sVar2;
  range_error *this_00;
  undefined4 in_register_00000034;
  string local_68;
  string local_48;
  
  if ((DIR *)this->mp_cur != (DIR *)0x0) {
    pdVar1 = readdir((DIR *)this->mp_cur);
    if (pdVar1 == (dirent *)0x0) {
      close_native_handle(this);
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      sVar2 = strlen(pdVar1->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,pdVar1->d_name,pdVar1->d_name + sVar2);
      filename_to_utf8(&local_68,&local_48);
      Path::operator=(this->mp_cur_path,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    return this;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,param_1));
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Tried to advance a finished entry_iterator!","");
  std::range_error::range_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

entry_iterator& entry_iterator::operator++(int)
{
  if (mp_cur) {
#if defined(_PATHIE_UNIX)
    struct dirent* p_dirent = readdir(static_cast<DIR*>(mp_cur));
    if (p_dirent) {
      *mp_cur_path = filename_to_utf8(p_dirent->d_name);
    }
    else {
      close_native_handle();
    }
#elif defined(_WIN32)
    WIN32_FIND_DATAW finddata;
    if (FindNextFileW(static_cast<HANDLE>(mp_cur), &finddata)) {
      *mp_cur_path = utf16_to_utf8(finddata.cFileName);
    }
    else {
      close_native_handle();
    }
#else
#error Unsupported system
#endif
  }
  else { // Finished already
    throw(std::range_error("Tried to advance a finished entry_iterator!"));
  }

  return *this;
}